

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtHasVar(word *t,int nVars,int iVar)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x582,"int Abc_TtHasVar(word *, int, int)");
  }
  bVar8 = (byte)iVar;
  if (nVars < 7) {
    uVar7 = (uint)((s_Truths6Neg[iVar] & (*t >> ((byte)(1 << (bVar8 & 0x1f)) & 0x3f) ^ *t)) != 0);
  }
  else if (iVar < 6) {
    uVar7 = 1;
    bVar4 = (char)nVars - 6U & 0x1f;
    uVar9 = (ulong)(uint)(1 << bVar4);
    if (1 << bVar4 < 1) {
      uVar9 = 0;
    }
    uVar10 = 0;
    do {
      if (uVar9 == uVar10) {
        return 0;
      }
      puVar1 = t + uVar10;
      uVar10 = uVar10 + 1;
    } while ((s_Truths6Neg[iVar] & (*puVar1 >> ((byte)(1 << (bVar8 & 0x1f)) & 0x3f) ^ *puVar1)) == 0
            );
  }
  else {
    bVar4 = bVar8 - 6 & 0x1f;
    uVar6 = 1 << bVar4;
    pwVar2 = t + (1 << ((char)nVars - 6U & 0x1f));
    uVar7 = 0 << bVar4;
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    for (; t < pwVar2; t = t + (2 << (bVar8 - 6 & 0x1f))) {
      uVar10 = 0;
      while (uVar9 != uVar10) {
        pwVar3 = t + uVar10;
        lVar5 = (long)(int)uVar6 + uVar10;
        uVar10 = uVar10 + 1;
        if (*pwVar3 != t[lVar5]) {
          return 1;
        }
      }
    }
  }
  return uVar7;
}

Assistant:

static inline int Abc_TtHasVar( word * t, int nVars, int iVar )
{
    assert( iVar < nVars );
    if ( nVars <= 6 )
        return Abc_Tt6HasVar( t[0], iVar );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        int nWords = Abc_TtWordNum( nVars );
        for ( i = 0; i < nWords; i++ )
            if ( ((t[i] >> Shift) & s_Truths6Neg[iVar]) != (t[i] & s_Truths6Neg[iVar]) )
                return 1;
        return 0;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + Abc_TtWordNum( nVars );
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( t[i] != t[Step+i] )
                    return 1;
        return 0;
    }
}